

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O3

int INT_CMCondition_has_failed(CManager cm,int condition)

{
  CMCondition p_Var1;
  
  p_Var1 = (CMCondition)&cm->control_list->condition_list;
  set_debug_flag(cm);
  do {
    p_Var1 = p_Var1->next;
    if (p_Var1 == (CMCondition)0x0) {
      fprintf(_stderr,"Serious internal error.  Use of condition %d, no longer in control list\n",
              condition);
      return -1;
    }
  } while (p_Var1->condition_num != condition);
  return p_Var1->failed;
}

Assistant:

extern int
INT_CMCondition_has_failed(CManager cm, int condition)
{
    int retval;
    CMCondition cond;
    CMControlList cl = cm->control_list;
    set_debug_flag(cm);

    cond = CMCondition_find(cl, condition);
    if (!cond) return -1;
    retval = cond->failed;
    
    return retval;
}